

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void calc_sad_update_bestmv_with_indices
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int num_candidates,
               int *chkpts_indices,int *cost_list)

{
  buf_2d *pbVar1;
  search_site_config *psVar2;
  int iVar3;
  uint this_sad;
  long lVar4;
  int i;
  long lVar5;
  undefined4 in_stack_00000024;
  FULLPEL_MV local_68;
  FULLPEL_MV local_64;
  buf_2d *local_60;
  FULLPEL_MOTION_SEARCH_PARAMS *local_58;
  MV_COST_PARAMS *local_50;
  FULLPEL_MV *local_48;
  uint8_t *local_40;
  uint *local_38;
  
  local_60 = (ms_params->ms_buffers).ref;
  pbVar1 = (ms_params->ms_buffers).src;
  psVar2 = ms_params->search_sites;
  local_64 = center_mv;
  local_58 = ms_params;
  local_50 = mv_cost_params;
  local_48 = best_mv;
  local_40 = center_address;
  local_38 = bestsad;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    lVar4 = (long)*(int *)(CONCAT44(in_stack_00000024,num_candidates) + lVar5 * 4);
    local_68.col = psVar2->site[(uint)search_step][lVar4].mv.col + center_mv.col;
    local_68.row = psVar2->site[(uint)search_step][lVar4].mv.row + local_64.row;
    iVar3 = av1_is_fullmv_in_range(&ms_params->mv_limits,local_68);
    if (iVar3 == 0) {
      if (chkpts_indices != (int *)0x0) {
        chkpts_indices[lVar4 + 1] = 0x7fffffff;
      }
    }
    else {
      this_sad = (*local_58->sdf)(pbVar1->buf,pbVar1->stride,
                                  local_40 + psVar2->site[(uint)search_step][lVar4].offset,
                                  local_60->stride);
      if (chkpts_indices != (int *)0x0) {
        chkpts_indices[lVar4 + 1] = this_sad;
      }
      iVar3 = update_mvs_and_sad(this_sad,&local_68,local_50,local_38,raw_bestsad,local_48,
                                 (FULLPEL_MV *)0x0);
      if (iVar3 != 0) {
        *best_site = (int)lVar5;
      }
    }
  }
  return;
}

Assistant:

static inline void calc_sad_update_bestmv_with_indices(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, const int num_candidates, const int *chkpts_indices,
    int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  // Loop over number of candidates.
  for (int i = 0; i < num_candidates; i++) {
    int index = chkpts_indices[i];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    if (!av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
      if (cost_list) {
        cost_list[index + 1] = INT_MAX;
      }
      continue;
    }
    const int thissad = get_mvpred_sad(
        ms_params, src, center_address + site[index].offset, ref->stride);
    if (cost_list) {
      cost_list[index + 1] = thissad;
    }
    const int found_better_mv = update_mvs_and_sad(
        thissad, &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = i;
  }
}